

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O3

void __thiscall SchnorrPubkey_Constructor_Test::TestBody(SchnorrPubkey_Constructor_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  SchnorrPubkey sk_obj;
  SchnorrPubkey b256_obj;
  SchnorrPubkey sk_pubkey;
  SchnorrPubkey empty_obj;
  Message local_d0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  AssertHelper local_c0;
  string local_b8;
  string local_98;
  SchnorrPubkey local_78;
  SchnorrPubkey local_60;
  SchnorrPubkey local_48;
  SchnorrPubkey local_30;
  
  cfd::core::SchnorrPubkey::FromPrivkey(&local_48,&::sk,(bool *)0x0);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&local_30);
  bVar2 = cfd::core::SchnorrPubkey::IsValid(&local_30);
  local_b8._M_dataplus._M_p._0_1_ = !bVar2;
  local_b8._M_string_length = 0;
  if (bVar2) {
    testing::Message::Message((Message *)&local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_b8,(AssertionResult *)"empty_obj.IsValid()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xa7,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if ((long *)local_78.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)local_78.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (long *)0x0)) {
        (**(code **)(*(long *)local_78.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::SchnorrPubkey::FromPrivkey(&local_78,&::sk,(bool *)0x0);
  cfd::core::SchnorrPubkey::GetData((ByteData *)&local_b8,&local_48);
  cfd::core::ByteData256::ByteData256((ByteData256 *)&local_98,(ByteData *)&local_b8);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&local_60,(ByteData256 *)&local_98);
  if ((long *)local_98._M_dataplus._M_p != (long *)0x0) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((void *)CONCAT71(local_b8._M_dataplus._M_p._1_7_,local_b8._M_dataplus._M_p._0_1_) !=
      (void *)0x0) {
    operator_delete((void *)CONCAT71(local_b8._M_dataplus._M_p._1_7_,local_b8._M_dataplus._M_p._0_1_
                                    ));
  }
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_98,&local_48);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_b8,&local_78);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_d0,"sk_pubkey.GetHex()","sk_obj.GetHex()",&local_98,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_b8._M_dataplus._M_p._1_7_,local_b8._M_dataplus._M_p._0_1_) !=
      &local_b8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_b8._M_dataplus._M_p._1_7_,local_b8._M_dataplus._M_p._0_1_));
  }
  paVar1 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_d0.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_c8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_c8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xac,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((long *)local_98._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_98._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_98._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_98,&local_48);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_b8,&local_60);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_d0,"sk_pubkey.GetHex()","b256_obj.GetHex()",&local_98,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_b8._M_dataplus._M_p._1_7_,local_b8._M_dataplus._M_p._0_1_) !=
      &local_b8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_b8._M_dataplus._M_p._1_7_,local_b8._M_dataplus._M_p._0_1_));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if (local_d0.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_c8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_c8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xad,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b8,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b8);
    if ((long *)local_98._M_dataplus._M_p != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_98._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_98._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8._M_dataplus._M_p._0_1_ = cfd::core::SchnorrPubkey::IsValid(&local_78);
  local_b8._M_string_length = 0;
  if (!(bool)local_b8._M_dataplus._M_p._0_1_) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_b8,(AssertionResult *)"sk_obj.IsValid()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xae,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if (CONCAT71(local_d0.ss_.ptr_._1_7_,local_d0.ss_.ptr_._0_1_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_d0.ss_.ptr_._1_7_,local_d0.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_d0.ss_.ptr_._1_7_,local_d0.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8._M_dataplus._M_p._0_1_ = cfd::core::SchnorrPubkey::IsValid(&local_60);
  local_b8._M_string_length = 0;
  if (!(bool)local_b8._M_dataplus._M_p._0_1_) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_b8,(AssertionResult *)"b256_obj.IsValid()","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xaf,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if (CONCAT71(local_d0.ss_.ptr_._1_7_,local_d0.ss_.ptr_._0_1_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_d0.ss_.ptr_._1_7_,local_d0.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_d0.ss_.ptr_._1_7_,local_d0.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_b8._M_dataplus._M_p._0_1_ = cfd::core::SchnorrPubkey::Equals(&local_78,&local_60);
  local_b8._M_string_length = 0;
  if (!(bool)local_b8._M_dataplus._M_p._0_1_) {
    testing::Message::Message(&local_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_b8,(AssertionResult *)"sk_obj.Equals(b256_obj)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0xb0,local_98._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_c0,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    if (CONCAT71(local_d0.ss_.ptr_._1_7_,local_d0.ss_.ptr_._0_1_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_d0.ss_.ptr_._1_7_,local_d0.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_d0.ss_.ptr_._1_7_,local_d0.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_b8._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_60.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((long *)local_78.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              ._M_impl.super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_78.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_30.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(SchnorrPubkey, Constructor) {
  auto sk_pubkey = SchnorrPubkey::FromPrivkey(sk);
  SchnorrPubkey empty_obj;

  EXPECT_FALSE(empty_obj.IsValid());

  auto sk_obj = SchnorrPubkey::FromPrivkey(sk);
  SchnorrPubkey b256_obj(ByteData256(sk_pubkey.GetData()));

  EXPECT_EQ(sk_pubkey.GetHex(), sk_obj.GetHex());
  EXPECT_EQ(sk_pubkey.GetHex(), b256_obj.GetHex());
  EXPECT_TRUE(sk_obj.IsValid());
  EXPECT_TRUE(b256_obj.IsValid());
  EXPECT_TRUE(sk_obj.Equals(b256_obj));
}